

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

EVP_HPKE_KEY * EVP_HPKE_KEY_new(void)

{
  EVP_HPKE_KEY *key;
  
  key = (EVP_HPKE_KEY *)OPENSSL_malloc(0x70);
  if (key == (EVP_HPKE_KEY *)0x0) {
    key = (EVP_HPKE_KEY *)0x0;
  }
  else {
    EVP_HPKE_KEY_zero(key);
  }
  return key;
}

Assistant:

EVP_HPKE_KEY *EVP_HPKE_KEY_new(void) {
  EVP_HPKE_KEY *key =
      reinterpret_cast<EVP_HPKE_KEY *>(OPENSSL_malloc(sizeof(EVP_HPKE_KEY)));
  if (key == NULL) {
    return NULL;
  }
  EVP_HPKE_KEY_zero(key);
  return key;
}